

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aac.cpp
# Opt level: O0

void __thiscall AACCodec::readConfig(AACCodec *this,uint8_t *buff,int size)

{
  uchar uVar1;
  int local_54;
  byte local_41;
  undefined1 local_40 [7];
  uchar object_type;
  BitStreamReader reader;
  int size_local;
  uint8_t *buff_local;
  AACCodec *this_local;
  
  reader.m_bitLeft = size;
  BitStreamReader::BitStreamReader((BitStreamReader *)local_40);
  BitStreamReader::setBuffer((BitStreamReader *)local_40,buff,buff + (int)reader.m_bitLeft);
  local_41 = BitStreamReader::getBits<unsigned_char>((BitStreamReader *)local_40,5);
  if (local_41 == 0x1f) {
    uVar1 = BitStreamReader::getBits<unsigned_char>((BitStreamReader *)local_40,6);
    local_41 = uVar1 + 0x20;
  }
  this->m_profile = (local_41 & 3) - 1;
  uVar1 = BitStreamReader::getBits<unsigned_char>((BitStreamReader *)local_40,4);
  this->m_sample_rates_index = uVar1;
  if (this->m_sample_rates_index == '\x0f') {
    local_54 = BitStreamReader::getBits<int>((BitStreamReader *)local_40,0x18);
  }
  else {
    local_54 = aac_sample_rates[this->m_sample_rates_index];
  }
  this->m_sample_rate = local_54;
  uVar1 = BitStreamReader::getBits<unsigned_char>((BitStreamReader *)local_40,4);
  this->m_channels_index = uVar1;
  this->m_channels = ""[this->m_channels_index];
  return;
}

Assistant:

void AACCodec::readConfig(uint8_t* buff, const int size)
{
    BitStreamReader reader{};
    reader.setBuffer(buff, buff + size);
    auto object_type = reader.getBits<uint8_t>(5);
    if (object_type == 31)
        object_type = 32 + reader.getBits<uint8_t>(6);
    m_profile = (object_type & 0x3) - 1;
    m_sample_rates_index = reader.getBits<uint8_t>(4);
    m_sample_rate = m_sample_rates_index == 0x0f ? reader.getBits<int>(24) : aac_sample_rates[m_sample_rates_index];
    m_channels_index = reader.getBits<uint8_t>(4);
    m_channels = aac_channels[m_channels_index];
    // return specific_config_bitindex;
}